

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

MakeNet * __thiscall notch::core::MakeNet::addLoss(MakeNet *this,LayerType lt)

{
  MakeLayer mk;
  LayerType local_44;
  value_type local_40;
  
  local_44 = lt;
  checkConfig(this);
  local_40.nInputs = this->nOutputs;
  local_40.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_40.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_40.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40.maybeActivation = (Activation *)0x0;
  local_40.nOutputs = local_40.nInputs;
  std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::push_back
            (&this->layerMakers,&local_40);
  std::vector<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>::
  push_back(&this->layerTypes,&local_44);
  this->nOutputs = 0;
  this->hasLoss = true;
  MakeLayer::~MakeLayer(&local_40);
  return this;
}

Assistant:

MakeNet &addLoss(LayerType lt) {
        checkConfig();
        MakeLayer mk(nOutputs);
        layerMakers.push_back(mk);
        layerTypes.push_back(lt);
        nOutputs = 0;
        hasLoss = true;
        return *this;
    }